

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O1

void __thiscall asl::Console::bgcolor(Console *this,int r,int g,int b)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  String local_60;
  String local_48;
  
  String::String(&local_48,"\x1b[48;");
  uVar3 = local_48.field_2._str;
  iVar1 = local_48._size;
  rgb(&local_60,this,r,g,b);
  if (iVar1 == 0) {
    uVar3 = &local_48.field_2;
  }
  uVar2 = local_60.field_2._str;
  if (local_60._size == 0) {
    uVar2 = &local_60.field_2;
  }
  printf("%s%s",uVar3,uVar2);
  if (local_60._size != 0) {
    free(local_60.field_2._str);
  }
  if (local_48._size != 0) {
    free(local_48.field_2._str);
  }
  return;
}

Assistant:

void Console::bgcolor(int r, int g, int b)
{
	printf("%s%s", *bg(), *rgb(r, g, b));
}